

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void _setParents<pfederc::FuncExpr>
               (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                *exprs,Expr *parent)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)exprs;
  while (p_Var1 = (((_List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)exprs) {
    *(Expr **)((long)p_Var1[1]._M_next + 8) = parent;
  }
  return;
}

Assistant:

static void _setParents(std::list<std::unique_ptr<T>> &exprs, Expr *parent) noexcept {
  for (std::unique_ptr<T> &expr : exprs) {
    expr->setParent(parent);
  }
}